

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void setup_global_motion_info_params(AV1_COMP *cpi)

{
  long in_RDI;
  YV12_BUFFER_CONFIG *source;
  GlobalMotionInfo *gm_info;
  int *in_stack_00000028;
  FrameDistPair (*in_stack_00000030) [7];
  YV12_BUFFER_CONFIG **in_stack_00000038;
  AV1_COMP *in_stack_00000040;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  *(int *)(in_RDI + 0x60700) = *(int *)(*(long *)(in_RDI + 0x427a8) + 0x10) + 0x1f >> 5;
  *(int *)(in_RDI + 0x60704) = *(int *)(*(long *)(in_RDI + 0x427a8) + 0x18) + 0x1f >> 5;
  memset((void *)(in_RDI + 0x60690),0xff,0x70);
  memset((void *)(in_RDI + 0x60688),0,8);
  update_valid_ref_frames_for_gm
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  qsort((void *)(in_RDI + 0x60690),(long)*(int *)(in_RDI + 0x60688),8,compare_distance);
  qsort((void *)(in_RDI + 0x606c8),(long)*(int *)(in_RDI + 0x6068c),8,compare_distance);
  if (*(char *)(in_RDI + 0x60930) == '\x03') {
    if (*(int *)(in_RDI + 0x6068c) < 1) {
      if (*(int *)(in_RDI + 0x60688) < 2) {
        local_24 = *(undefined4 *)(in_RDI + 0x60688);
      }
      else {
        local_24 = 2;
      }
      *(undefined4 *)(in_RDI + 0x60688) = local_24;
    }
    else {
      if (*(int *)(in_RDI + 0x60688) < 1) {
        local_1c = *(undefined4 *)(in_RDI + 0x60688);
      }
      else {
        local_1c = 1;
      }
      *(undefined4 *)(in_RDI + 0x60688) = local_1c;
      if (*(int *)(in_RDI + 0x6068c) < 1) {
        local_20 = *(undefined4 *)(in_RDI + 0x6068c);
      }
      else {
        local_20 = 1;
      }
      *(undefined4 *)(in_RDI + 0x6068c) = local_20;
    }
  }
  return;
}

Assistant:

static inline void setup_global_motion_info_params(AV1_COMP *cpi) {
  GlobalMotionInfo *const gm_info = &cpi->gm_info;
  YV12_BUFFER_CONFIG *source = cpi->source;

  gm_info->segment_map_w =
      (source->y_crop_width + WARP_ERROR_BLOCK - 1) >> WARP_ERROR_BLOCK_LOG;
  gm_info->segment_map_h =
      (source->y_crop_height + WARP_ERROR_BLOCK - 1) >> WARP_ERROR_BLOCK_LOG;

  memset(gm_info->reference_frames, -1,
         sizeof(gm_info->reference_frames[0][0]) * MAX_DIRECTIONS *
             (REF_FRAMES - 1));
  av1_zero(gm_info->num_ref_frames);

  // Populate ref_buf for valid ref frames in global motion
  update_valid_ref_frames_for_gm(cpi, gm_info->ref_buf,
                                 gm_info->reference_frames,
                                 gm_info->num_ref_frames);

  // Sort the past and future ref frames in the ascending order of their
  // distance from the current frame. reference_frames[0] => past direction
  // and reference_frames[1] => future direction.
  qsort(gm_info->reference_frames[0], gm_info->num_ref_frames[0],
        sizeof(gm_info->reference_frames[0][0]), compare_distance);
  qsort(gm_info->reference_frames[1], gm_info->num_ref_frames[1],
        sizeof(gm_info->reference_frames[1][0]), compare_distance);

  if (cpi->sf.gm_sf.gm_search_type == GM_SEARCH_CLOSEST_REFS_ONLY) {
    // Filter down to the nearest two ref frames.
    // Prefer one past and one future ref over two past refs, even if
    // the second past ref is closer
    if (gm_info->num_ref_frames[1] > 0) {
      gm_info->num_ref_frames[0] = AOMMIN(gm_info->num_ref_frames[0], 1);
      gm_info->num_ref_frames[1] = AOMMIN(gm_info->num_ref_frames[1], 1);
    } else {
      gm_info->num_ref_frames[0] = AOMMIN(gm_info->num_ref_frames[0], 2);
    }
  }
}